

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_helper.cc
# Opt level: O0

int bio_socket_nbio(int sock,int on)

{
  int iVar1;
  undefined4 local_18;
  int flags;
  int on_local;
  int sock_local;
  
  local_18 = fcntl(sock,3,0);
  if ((int)local_18 < 0) {
    on_local = 0;
  }
  else {
    if (on == 0) {
      local_18 = local_18 & 0xfffff7ff;
    }
    else {
      local_18 = local_18 | 0x800;
    }
    iVar1 = fcntl(sock,4,(ulong)local_18);
    on_local = (int)(iVar1 == 0);
  }
  return on_local;
}

Assistant:

int bio_socket_nbio(int sock, int on) {
#if defined(OPENSSL_WINDOWS)
  u_long arg = on;

  return 0 == ioctlsocket(sock, FIONBIO, &arg);
#else
  int flags = fcntl(sock, F_GETFL, 0);
  if (flags < 0) {
    return 0;
  }
  if (!on) {
    flags &= ~O_NONBLOCK;
  } else {
    flags |= O_NONBLOCK;
  }
  return fcntl(sock, F_SETFL, flags) == 0;
#endif
}